

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxerutil.cc
# Opt level: O2

int32 mkvmuxer::GetCodedUIntSize(uint64 value)

{
  int32 iVar1;
  
  if (value < 0x7f) {
    iVar1 = 1;
  }
  else if (value < 0x3fff) {
    iVar1 = 2;
  }
  else if (value < 0x1fffff) {
    iVar1 = 3;
  }
  else if (value < 0xfffffff) {
    iVar1 = 4;
  }
  else if (value < 0x7ffffffff) {
    iVar1 = 5;
  }
  else {
    if (0x3fffffffffe < value) {
      return 8 - (uint)(value < 0x1ffffffffffff);
    }
    iVar1 = 6;
  }
  return iVar1;
}

Assistant:

int32 GetCodedUIntSize(uint64 value) {
  if (value < 0x000000000000007FULL)
    return 1;
  else if (value < 0x0000000000003FFFULL)
    return 2;
  else if (value < 0x00000000001FFFFFULL)
    return 3;
  else if (value < 0x000000000FFFFFFFULL)
    return 4;
  else if (value < 0x00000007FFFFFFFFULL)
    return 5;
  else if (value < 0x000003FFFFFFFFFFULL)
    return 6;
  else if (value < 0x0001FFFFFFFFFFFFULL)
    return 7;
  return 8;
}